

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O3

void FastPForLib::Simple9<true,_false>::unpack3_9(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x19 & 7;
  puVar2[1] = *puVar1 >> 0x16 & 7;
  puVar2[2] = *puVar1 >> 0x13 & 7;
  puVar2[3] = *(ushort *)((long)puVar1 + 2) & 7;
  puVar2[4] = *puVar1 >> 0xd & 7;
  puVar2[5] = *puVar1 >> 10 & 7;
  puVar2[6] = *puVar1 >> 7 & 7;
  puVar2[7] = *puVar1 >> 4 & 7;
  puVar2[8] = *puVar1 >> 1 & 7;
  *in = puVar1 + 1;
  *out = puVar2 + 9;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack3_9(uint32_t **out,
                                            const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 25) & 0x07;
  pout[1] = (pin[0] >> 22) & 0x07;
  pout[2] = (pin[0] >> 19) & 0x07;
  pout[3] = (pin[0] >> 16) & 0x07;
  pout[4] = (pin[0] >> 13) & 0x07;
  pout[5] = (pin[0] >> 10) & 0x07;
  pout[6] = (pin[0] >> 7) & 0x07;
  pout[7] = (pin[0] >> 4) & 0x07;
  pout[8] = (pin[0] >> 1) & 0x07;

  *in = pin + 1;
  *out = pout + 9;
}